

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O2

void auto_compaction_snapshots_test(void)

{
  void *pvVar1;
  fdb_doc *pfVar2;
  fdb_kvs_handle *handle;
  fdb_seqnum_t fVar3;
  fdb_status fVar4;
  int iVar5;
  size_t sVar6;
  uint uVar7;
  char *__format;
  fdb_kvs_handle *snapshot;
  fdb_doc *rdoc;
  fdb_kvs_handle *kvs;
  fdb_file_handle *file;
  int num_compactions;
  char str [64];
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  fdb_kvs_info info;
  fdb_config local_128;
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  num_compactions = 0;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fdb_get_default_config();
  local_128.compaction_mode = '\x01';
  local_128.seqtree_opt = '\x01';
  local_128.compaction_cb = compaction_cb_count;
  local_128.compaction_cb_mask = 0x20;
  local_128.compactor_sleep_duration = 1;
  local_128.compaction_cb_ctx = &num_compactions;
  fVar4 = fdb_open(&file,"mvcc_test1",&local_128);
  if (fVar4 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x129b);
    auto_compaction_snapshots_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x129b,"void auto_compaction_snapshots_test()");
  }
  fdb_get_default_kvs_config();
  kvs_config.custom_cmp_param = (void *)str._16_8_;
  kvs_config.create_if_missing = (bool)str[0];
  kvs_config._1_1_ = str[1];
  kvs_config._2_1_ = str[2];
  kvs_config._3_1_ = str[3];
  kvs_config._4_1_ = str[4];
  kvs_config._5_1_ = str[5];
  kvs_config._6_1_ = str[6];
  kvs_config._7_1_ = str[7];
  kvs_config.custom_cmp = (fdb_custom_cmp_variable)str._8_8_;
  fVar4 = fdb_kvs_open_default(file,&kvs,&kvs_config);
  if (fVar4 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x12a0);
    auto_compaction_snapshots_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x12a0,"void auto_compaction_snapshots_test()");
  }
  uVar7 = 0;
  do {
    if (uVar7 == 100000) {
      fVar4 = fdb_close(file);
      if (fVar4 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x12d2);
        auto_compaction_snapshots_test()::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x12d2,"void auto_compaction_snapshots_test()");
      }
      fVar4 = fdb_shutdown();
      if (fVar4 == FDB_RESULT_SUCCESS) {
        memleak_end();
        sprintf(str,"auto compaction completed %d times with snapshots",(ulong)(uint)num_compactions
               );
        __format = "%s PASSED\n";
        if (auto_compaction_snapshots_test()::__test_pass != '\0') {
          __format = "%s FAILED\n";
        }
        fprintf(_stderr,__format,str);
        return;
      }
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x12d4);
      auto_compaction_snapshots_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x12d4,"void auto_compaction_snapshots_test()");
    }
    sprintf(str,"%d",(ulong)uVar7);
    handle = kvs;
    sVar6 = strlen(str);
    fVar4 = fdb_set_kv(handle,str,sVar6,"value",5);
    if (fVar4 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x12a6);
      auto_compaction_snapshots_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x12a6,"void auto_compaction_snapshots_test()");
    }
    if ((uVar7 / 10) * 10 == uVar7) {
      fVar4 = fdb_commit(file,'\0');
      if (fVar4 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x12ab);
        auto_compaction_snapshots_test()::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x12ab,"void auto_compaction_snapshots_test()");
      }
    }
    if ((uVar7 / 100) * 100 == uVar7) {
      fVar4 = fdb_get_kvs_info(kvs,&info);
      fVar3 = info.last_seqnum;
      if (fVar4 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x12b1);
        auto_compaction_snapshots_test()::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x12b1,"void auto_compaction_snapshots_test()");
      }
      fVar4 = fdb_snapshot_open(kvs,&snapshot,info.last_seqnum);
      if (fVar4 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x12b5);
        auto_compaction_snapshots_test()::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x12b5,"void auto_compaction_snapshots_test()");
      }
      fdb_doc_create(&rdoc,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
      rdoc->seqnum = fVar3;
      fVar4 = fdb_get_byseq(snapshot,rdoc);
      pfVar2 = rdoc;
      if (fVar4 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x12ba);
        auto_compaction_snapshots_test()::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x12ba,"void auto_compaction_snapshots_test()");
      }
      pvVar1 = rdoc->key;
      sVar6 = strlen(str);
      iVar5 = bcmp(pvVar1,str,sVar6);
      if (iVar5 != 0) {
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",str,pvVar1,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x12bb);
        auto_compaction_snapshots_test()::__test_pass = 1;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x12bb,"void auto_compaction_snapshots_test()");
      }
      fdb_doc_free(pfVar2);
      fVar4 = fdb_kvs_close(snapshot);
      if (fVar4 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x12bf);
        auto_compaction_snapshots_test()::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x12bf,"void auto_compaction_snapshots_test()");
      }
      fVar4 = fdb_snapshot_open(kvs,&snapshot,0xffffffffffffffff);
      if (fVar4 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x12c3);
        auto_compaction_snapshots_test()::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x12c3,"void auto_compaction_snapshots_test()");
      }
      fdb_doc_create(&rdoc,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
      rdoc->seqnum = fVar3;
      fVar4 = fdb_get_byseq(snapshot,rdoc);
      pfVar2 = rdoc;
      if (fVar4 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x12c8);
        auto_compaction_snapshots_test()::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x12c8,"void auto_compaction_snapshots_test()");
      }
      pvVar1 = rdoc->key;
      sVar6 = strlen(str);
      iVar5 = bcmp(pvVar1,str,sVar6);
      if (iVar5 != 0) {
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",str,pvVar1,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x12c9);
        auto_compaction_snapshots_test()::__test_pass = 1;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x12c9,"void auto_compaction_snapshots_test()");
      }
      fdb_doc_free(pfVar2);
      fVar4 = fdb_kvs_close(snapshot);
      if (fVar4 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x12cd);
        auto_compaction_snapshots_test()::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x12cd,"void auto_compaction_snapshots_test()");
      }
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

void auto_compaction_snapshots_test()
{
    TEST_INIT();

    memleak_start();

    fdb_file_handle *file;
    fdb_kvs_handle *kvs, *snapshot;
    fdb_status status;
    fdb_config config;
    fdb_kvs_config kvs_config;
    fdb_seqnum_t seqnum;
    fdb_kvs_info info;
    fdb_doc *rdoc;
    int num_compactions = 0;
    char str[64];

    int i, r;

    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    // Open Database File
    config = fdb_get_default_config();
    config.compaction_mode = FDB_COMPACTION_AUTO;
    config.seqtree_opt = FDB_SEQTREE_USE; // enable seqtree since get_byseq
    config.compaction_cb = compaction_cb_count;
    config.compaction_cb_ctx = &num_compactions;
    config.compaction_cb_mask = FDB_CS_COMPLETE;
    config.compactor_sleep_duration=1;
    status = fdb_open(&file, "mvcc_test1", &config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Open KV Store
    kvs_config = fdb_get_default_kvs_config();
    status = fdb_kvs_open_default(file, &kvs, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Several kv pairs
    for(i=0;i<100000;i++) {
        sprintf(str, "%d", i);
        status = fdb_set_kv(kvs, str, strlen(str), (void*)"value", 5);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        // Every 10 Commit
        if (i % 10 == 0) {
            status = fdb_commit(file, FDB_COMMIT_NORMAL);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }

        // Every 100 iterations Get Seq/Snapshot
        if (i % 100 == 0) {
            status = fdb_get_kvs_info(kvs, &info);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            seqnum = info.last_seqnum;
            // Open durable snapshot in the midst of compaction..
            status = fdb_snapshot_open(kvs, &snapshot, seqnum);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            // verify last doc set is captured in snapshot..
            fdb_doc_create(&rdoc, NULL, 0, NULL, 0, NULL, 0);
            rdoc->seqnum = seqnum;
            status = fdb_get_byseq(snapshot, rdoc);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            TEST_CMP(rdoc->key, str, strlen(str));
            // free result document
            fdb_doc_free(rdoc);
            status = fdb_kvs_close(snapshot);
            TEST_CHK(status == FDB_RESULT_SUCCESS);

            // Open in-memory snapshot and verify content
            status = fdb_snapshot_open(kvs, &snapshot, FDB_SNAPSHOT_INMEM);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            // verify last doc set is captured in snapshot..
            fdb_doc_create(&rdoc, NULL, 0, NULL, 0, NULL, 0);
            rdoc->seqnum = seqnum;
            status = fdb_get_byseq(snapshot, rdoc);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            TEST_CMP(rdoc->key, str, strlen(str));
            // free result document
            fdb_doc_free(rdoc);
            status = fdb_kvs_close(snapshot);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
    }

    status = fdb_close(file);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_shutdown();
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    memleak_end();

    sprintf(str, "auto compaction completed %d times with snapshots",
            num_compactions);
    TEST_RESULT(str);
}